

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O1

ForStatement * __thiscall ninx::parser::element::ForStatement::clone_impl(ForStatement *this)

{
  pointer pcVar1;
  ForStatement *pFVar2;
  Expression *local_20;
  Block *local_18;
  
  pFVar2 = (ForStatement *)operator_new(0x48);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_20);
  ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&local_18);
  (pFVar2->super_Statement).super_ASTElement.parent = (Block *)0x0;
  (pFVar2->super_Statement).super_ASTElement.__output_block = (Block *)0x0;
  (pFVar2->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__ForStatement_00150810;
  (pFVar2->iterator_name)._M_dataplus._M_p = (pointer)&(pFVar2->iterator_name).field_2;
  pcVar1 = (this->iterator_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar2->iterator_name,pcVar1,pcVar1 + (this->iterator_name)._M_string_length
            );
  (pFVar2->range_expr)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl = local_20;
  (pFVar2->body)._M_t.
  super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
  .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = local_18;
  return pFVar2;
}

Assistant:

ninx::parser::element::ForStatement *ninx::parser::element::ForStatement::clone_impl() {
    return new ForStatement(this->iterator_name, this->range_expr->clone<Expression>(), this->body->clone<Block>());
}